

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint bias;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  parasail_result_t *result;
  __m128i *palVar14;
  __m128i *palVar15;
  __m128i *b;
  __m128i *palVar16;
  char *pcVar17;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  ulong uVar18;
  char *__format;
  int iVar19;
  undefined8 in_R9;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ushort uVar24;
  undefined4 uVar26;
  undefined4 uVar28;
  ushort uVar35;
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar43;
  undefined1 auVar29 [16];
  undefined4 uVar27;
  ushort uVar33;
  ushort uVar45;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  short sVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar51 [16];
  short sVar58;
  __m128i c;
  __m128i c_00;
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffec8;
  ulong local_128;
  undefined4 local_11c;
  ulong local_118;
  __m128i *local_110;
  undefined1 local_108 [16];
  short sVar25;
  short sVar34;
  short sVar36;
  short sVar38;
  short sVar40;
  short sVar42;
  short sVar44;
  short sVar46;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar17 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar17 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar17 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar17 = "open";
        }
        else {
          if (-1 < gap) {
            iVar13 = ppVar5->max;
            result = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              uVar23 = (ulong)uVar3 + 7 >> 3;
              result->flag = result->flag | 0x8220804;
              palVar14 = parasail_memalign___m128i(0x10,uVar23);
              palVar15 = parasail_memalign___m128i(0x10,uVar23);
              local_110 = parasail_memalign___m128i(0x10,uVar23);
              b = parasail_memalign___m128i(0x10,uVar23);
              auVar29._0_4_ = -(uint)((int)((ulong)palVar14 >> 0x20) == 0 && (int)palVar14 == 0);
              auVar29._4_4_ = -(uint)((int)palVar15 == 0 && (int)((ulong)palVar15 >> 0x20) == 0);
              auVar29._8_4_ = -(uint)((int)((ulong)local_110 >> 0x20) == 0 && (int)local_110 == 0);
              auVar29._12_4_ = -(uint)((int)b == 0 && (int)((ulong)b >> 0x20) == 0);
              iVar12 = movmskps((int)b,auVar29);
              if (iVar12 == 0) {
                local_118 = 0;
                auVar29 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar26 = auVar29._0_4_;
                auVar29 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar27 = auVar29._0_4_;
                c[1] = extraout_RDX;
                c[0] = uVar23;
                palVar16 = palVar14;
                parasail_memset___m128i(palVar14,c,(size_t)palVar14);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar23;
                parasail_memset___m128i(b,c_00,(size_t)palVar16);
                bias = (uint)uVar23;
                local_11c = 0x8000;
                uVar22 = 0;
                auVar50 = _DAT_008a1ec0;
                local_108 = _DAT_008a1ec0;
                do {
                  palVar16 = palVar14;
                  local_128 = (ulong)(uint)s2Len;
                  if (uVar22 == (uint)s2Len) {
LAB_005677ba:
                    if ((short)local_11c == 0x7fff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar13 = parasail_result_is_saturated(result);
                    palVar14 = local_110;
                    if (iVar13 == 0) {
                      iVar12 = (int)local_128 + -1;
                      iVar13 = (int)local_128 + -2;
                      if ((int)local_118 == iVar13) {
                        palVar14 = palVar15;
                      }
                      if ((int)local_118 == iVar12) {
                        palVar14 = palVar16;
                        palVar16 = local_110;
                      }
                      iVar20 = uVar3 - 1;
                      for (uVar23 = 0; (bias & 0xfffffff) << 3 != (uint)uVar23; uVar23 = uVar23 + 1)
                      {
                        if ((*(short *)((long)*palVar14 + uVar23 * 2) == (short)local_11c) &&
                           (iVar19 = ((uint)uVar23 & 7) * bias + ((uint)(uVar23 >> 3) & 0x1fffffff),
                           iVar19 < iVar20)) {
                          iVar20 = iVar19;
                        }
                      }
                      if ((int)local_118 != iVar13) {
                        local_110 = palVar15;
                      }
                      if ((int)local_118 != iVar12) {
                        palVar15 = local_110;
                      }
                      iVar13 = (short)local_11c + 0x8000;
                    }
                    else {
                      local_118._0_4_ = 0;
                      iVar13 = 0xffff;
                      iVar20 = 0;
                    }
                    result->score = iVar13;
                    result->end_query = iVar20;
                    result->end_ref = (int)local_118;
                    parasail_free(b);
                    parasail_free(palVar14);
                    parasail_free(palVar15);
                    parasail_free(palVar16);
                    return result;
                  }
                  uVar18 = palVar14[bias - 1][0];
                  auVar51._0_8_ = uVar18 << 0x10;
                  auVar51._8_8_ = palVar14[bias - 1][1] << 0x10 | uVar18 >> 0x30;
                  iVar12 = ppVar5->mapper[(byte)s2[uVar22]];
                  iVar20 = (int)uVar22;
                  palVar16 = palVar15;
                  if ((int)local_118 == iVar20 + -2) {
                    palVar16 = local_110;
                  }
                  auVar51 = auVar51 | _DAT_008a1ed0;
                  lVar21 = 0;
                  auVar49 = _DAT_008a1ec0;
                  for (uVar18 = 0; uVar23 != uVar18; uVar18 = uVar18 + 1) {
                    auVar51 = paddsw(auVar51,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar21 + (long)(int)(iVar12 * bias) * 0x10));
                    pauVar2 = (undefined1 (*) [16])((long)*b + lVar21);
                    sVar42 = *(short *)*pauVar2;
                    sVar44 = *(short *)(*pauVar2 + 2);
                    sVar46 = *(short *)(*pauVar2 + 4);
                    sVar25 = *(short *)(*pauVar2 + 6);
                    sVar34 = *(short *)(*pauVar2 + 8);
                    sVar36 = *(short *)(*pauVar2 + 10);
                    sVar38 = *(short *)(*pauVar2 + 0xc);
                    sVar47 = *(short *)(*pauVar2 + 0xe);
                    auVar29 = *pauVar2;
                    sVar40 = auVar49._0_2_;
                    uVar24 = (ushort)(sVar42 < sVar40) * sVar40 |
                             (ushort)(sVar42 >= sVar40) * sVar42;
                    sVar40 = auVar49._2_2_;
                    uVar33 = (ushort)(sVar44 < sVar40) * sVar40 |
                             (ushort)(sVar44 >= sVar40) * sVar44;
                    sVar40 = auVar49._4_2_;
                    uVar35 = (ushort)(sVar46 < sVar40) * sVar40 |
                             (ushort)(sVar46 >= sVar40) * sVar46;
                    sVar40 = auVar49._6_2_;
                    uVar37 = (ushort)(sVar25 < sVar40) * sVar40 |
                             (ushort)(sVar25 >= sVar40) * sVar25;
                    sVar40 = auVar49._8_2_;
                    uVar39 = (ushort)(sVar34 < sVar40) * sVar40 |
                             (ushort)(sVar34 >= sVar40) * sVar34;
                    sVar40 = auVar49._10_2_;
                    uVar41 = (ushort)(sVar36 < sVar40) * sVar40 |
                             (ushort)(sVar36 >= sVar40) * sVar36;
                    sVar40 = auVar49._12_2_;
                    uVar43 = (ushort)(sVar38 < sVar40) * sVar40 |
                             (ushort)(sVar38 >= sVar40) * sVar38;
                    sVar40 = auVar49._14_2_;
                    uVar45 = (ushort)(sVar47 < sVar40) * sVar40 |
                             (ushort)(sVar47 >= sVar40) * sVar47;
                    sVar40 = auVar51._0_2_;
                    uVar24 = (ushort)((short)uVar24 < sVar40) * sVar40 |
                             ((short)uVar24 >= sVar40) * uVar24;
                    sVar40 = auVar51._2_2_;
                    uVar33 = (ushort)((short)uVar33 < sVar40) * sVar40 |
                             ((short)uVar33 >= sVar40) * uVar33;
                    sVar40 = auVar51._4_2_;
                    uVar35 = (ushort)((short)uVar35 < sVar40) * sVar40 |
                             ((short)uVar35 >= sVar40) * uVar35;
                    sVar40 = auVar51._6_2_;
                    uVar37 = (ushort)((short)uVar37 < sVar40) * sVar40 |
                             ((short)uVar37 >= sVar40) * uVar37;
                    sVar40 = auVar51._8_2_;
                    uVar39 = (ushort)((short)uVar39 < sVar40) * sVar40 |
                             ((short)uVar39 >= sVar40) * uVar39;
                    sVar40 = auVar51._10_2_;
                    uVar41 = (ushort)((short)uVar41 < sVar40) * sVar40 |
                             ((short)uVar41 >= sVar40) * uVar41;
                    sVar40 = auVar51._12_2_;
                    uVar43 = (ushort)((short)uVar43 < sVar40) * sVar40 |
                             ((short)uVar43 >= sVar40) * uVar43;
                    sVar40 = auVar51._14_2_;
                    uVar45 = (ushort)((short)uVar45 < sVar40) * sVar40 |
                             ((short)uVar45 >= sVar40) * uVar45;
                    puVar1 = (ushort *)((long)*palVar16 + lVar21);
                    *puVar1 = uVar24;
                    puVar1[1] = uVar33;
                    puVar1[2] = uVar35;
                    puVar1[3] = uVar37;
                    puVar1[4] = uVar39;
                    puVar1[5] = uVar41;
                    puVar1[6] = uVar43;
                    puVar1[7] = uVar45;
                    vH[0] = uVar18 & 0xffffffff;
                    vH[1] = uVar23;
                    arr_store_si128(((result->field_4).rowcols)->score_row,vH,iVar20,s2Len,
                                    (int32_t)in_R9,in_stack_fffffffffffffec8,bias);
                    auVar11._2_2_ = uVar33;
                    auVar11._0_2_ = uVar24;
                    auVar11._4_2_ = uVar35;
                    auVar11._6_2_ = uVar37;
                    auVar11._8_2_ = uVar39;
                    auVar11._10_2_ = uVar41;
                    auVar11._12_2_ = uVar43;
                    auVar11._14_2_ = uVar45;
                    local_108._2_2_ =
                         ((short)local_108._2_2_ < (short)uVar33) * uVar33 |
                         (ushort)((short)local_108._2_2_ >= (short)uVar33) * local_108._2_2_;
                    local_108._0_2_ =
                         ((short)local_108._0_2_ < (short)uVar24) * uVar24 |
                         (ushort)((short)local_108._0_2_ >= (short)uVar24) * local_108._0_2_;
                    local_108._4_2_ =
                         ((short)local_108._4_2_ < (short)uVar35) * uVar35 |
                         (ushort)((short)local_108._4_2_ >= (short)uVar35) * local_108._4_2_;
                    local_108._6_2_ =
                         ((short)local_108._6_2_ < (short)uVar37) * uVar37 |
                         (ushort)((short)local_108._6_2_ >= (short)uVar37) * local_108._6_2_;
                    local_108._8_2_ =
                         ((short)local_108._8_2_ < (short)uVar39) * uVar39 |
                         (ushort)((short)local_108._8_2_ >= (short)uVar39) * local_108._8_2_;
                    local_108._10_2_ =
                         ((short)local_108._10_2_ < (short)uVar41) * uVar41 |
                         (ushort)((short)local_108._10_2_ >= (short)uVar41) * local_108._10_2_;
                    local_108._12_2_ =
                         ((short)local_108._12_2_ < (short)uVar43) * uVar43 |
                         (ushort)((short)local_108._12_2_ >= (short)uVar43) * local_108._12_2_;
                    local_108._14_2_ =
                         ((short)local_108._14_2_ < (short)uVar45) * uVar45 |
                         (ushort)((short)local_108._14_2_ >= (short)uVar45) * local_108._14_2_;
                    auVar9._4_4_ = uVar26;
                    auVar9._0_4_ = uVar26;
                    auVar9._8_4_ = uVar26;
                    auVar9._12_4_ = uVar26;
                    auVar51 = psubsw(auVar11,auVar9);
                    auVar7._4_4_ = uVar27;
                    auVar7._0_4_ = uVar27;
                    auVar7._8_4_ = uVar27;
                    auVar7._12_4_ = uVar27;
                    auVar29 = psubsw(auVar29,auVar7);
                    sVar40 = auVar51._0_2_;
                    sVar47 = auVar29._0_2_;
                    sVar42 = auVar51._2_2_;
                    sVar52 = auVar29._2_2_;
                    sVar44 = auVar51._4_2_;
                    sVar53 = auVar29._4_2_;
                    sVar46 = auVar51._6_2_;
                    sVar54 = auVar29._6_2_;
                    sVar25 = auVar51._8_2_;
                    sVar55 = auVar29._8_2_;
                    sVar34 = auVar51._10_2_;
                    sVar56 = auVar29._10_2_;
                    sVar36 = auVar51._12_2_;
                    sVar57 = auVar29._12_2_;
                    sVar58 = auVar29._14_2_;
                    sVar38 = auVar51._14_2_;
                    puVar1 = (ushort *)((long)*b + lVar21);
                    *puVar1 = (ushort)(sVar47 < sVar40) * sVar40 |
                              (ushort)(sVar47 >= sVar40) * sVar47;
                    puVar1[1] = (ushort)(sVar52 < sVar42) * sVar42 |
                                (ushort)(sVar52 >= sVar42) * sVar52;
                    puVar1[2] = (ushort)(sVar53 < sVar44) * sVar44 |
                                (ushort)(sVar53 >= sVar44) * sVar53;
                    puVar1[3] = (ushort)(sVar54 < sVar46) * sVar46 |
                                (ushort)(sVar54 >= sVar46) * sVar54;
                    puVar1[4] = (ushort)(sVar55 < sVar25) * sVar25 |
                                (ushort)(sVar55 >= sVar25) * sVar55;
                    puVar1[5] = (ushort)(sVar56 < sVar34) * sVar34 |
                                (ushort)(sVar56 >= sVar34) * sVar56;
                    puVar1[6] = (ushort)(sVar57 < sVar36) * sVar36 |
                                (ushort)(sVar57 >= sVar36) * sVar57;
                    puVar1[7] = (ushort)(sVar58 < sVar38) * sVar38 |
                                (ushort)(sVar58 >= sVar38) * sVar58;
                    auVar29 = psubsw(auVar49,auVar7);
                    sVar47 = auVar29._0_2_;
                    auVar49._0_2_ =
                         (ushort)(sVar47 < sVar40) * sVar40 | (ushort)(sVar47 >= sVar40) * sVar47;
                    sVar40 = auVar29._2_2_;
                    auVar49._2_2_ =
                         (ushort)(sVar40 < sVar42) * sVar42 | (ushort)(sVar40 >= sVar42) * sVar40;
                    sVar40 = auVar29._4_2_;
                    auVar49._4_2_ =
                         (ushort)(sVar40 < sVar44) * sVar44 | (ushort)(sVar40 >= sVar44) * sVar40;
                    sVar40 = auVar29._6_2_;
                    auVar49._6_2_ =
                         (ushort)(sVar40 < sVar46) * sVar46 | (ushort)(sVar40 >= sVar46) * sVar40;
                    sVar40 = auVar29._8_2_;
                    auVar49._8_2_ =
                         (ushort)(sVar40 < sVar25) * sVar25 | (ushort)(sVar40 >= sVar25) * sVar40;
                    sVar40 = auVar29._10_2_;
                    auVar49._10_2_ =
                         (ushort)(sVar40 < sVar34) * sVar34 | (ushort)(sVar40 >= sVar34) * sVar40;
                    sVar40 = auVar29._12_2_;
                    sVar42 = auVar29._14_2_;
                    auVar49._12_2_ =
                         (ushort)(sVar40 < sVar36) * sVar36 | (ushort)(sVar40 >= sVar36) * sVar40;
                    auVar49._14_2_ =
                         (ushort)(sVar42 < sVar38) * sVar38 | (ushort)(sVar42 >= sVar38) * sVar42;
                    auVar51 = *(undefined1 (*) [16])((long)*palVar14 + lVar21);
                    lVar21 = lVar21 + 0x10;
                  }
                  if ((int)local_118 == iVar20 + -2) {
                    local_110 = palVar15;
                  }
                  for (iVar12 = 0; iVar12 != 8; iVar12 = iVar12 + 1) {
                    auVar48._0_8_ = auVar49._0_8_ << 0x10;
                    auVar48._8_8_ = auVar49._8_8_ << 0x10 | auVar49._0_8_ >> 0x30;
                    auVar49 = auVar48 | _DAT_008a1ed0;
                    palVar15 = palVar16;
                    for (uVar18 = 0; uVar23 != uVar18; uVar18 = uVar18 + 1) {
                      sVar42 = (short)(*palVar15)[0];
                      sVar44 = *(short *)((long)*palVar15 + 2);
                      sVar46 = *(short *)((long)*palVar15 + 4);
                      sVar25 = *(short *)((long)*palVar15 + 6);
                      sVar34 = (short)(*palVar15)[1];
                      sVar36 = *(short *)((long)*palVar15 + 10);
                      sVar38 = *(short *)((long)*palVar15 + 0xc);
                      sVar47 = *(short *)((long)*palVar15 + 0xe);
                      sVar40 = auVar49._0_2_;
                      uVar24 = (ushort)(sVar42 < sVar40) * sVar40 |
                               (ushort)(sVar42 >= sVar40) * sVar42;
                      sVar40 = auVar49._2_2_;
                      uVar33 = (ushort)(sVar44 < sVar40) * sVar40 |
                               (ushort)(sVar44 >= sVar40) * sVar44;
                      sVar40 = auVar49._4_2_;
                      uVar35 = (ushort)(sVar46 < sVar40) * sVar40 |
                               (ushort)(sVar46 >= sVar40) * sVar46;
                      sVar40 = auVar49._6_2_;
                      uVar37 = (ushort)(sVar25 < sVar40) * sVar40 |
                               (ushort)(sVar25 >= sVar40) * sVar25;
                      sVar40 = auVar49._8_2_;
                      uVar39 = (ushort)(sVar34 < sVar40) * sVar40 |
                               (ushort)(sVar34 >= sVar40) * sVar34;
                      sVar40 = auVar49._10_2_;
                      uVar41 = (ushort)(sVar36 < sVar40) * sVar40 |
                               (ushort)(sVar36 >= sVar40) * sVar36;
                      sVar40 = auVar49._12_2_;
                      uVar43 = (ushort)(sVar38 < sVar40) * sVar40 |
                               (ushort)(sVar38 >= sVar40) * sVar38;
                      sVar40 = auVar49._14_2_;
                      uVar45 = (ushort)(sVar47 < sVar40) * sVar40 |
                               (ushort)(sVar47 >= sVar40) * sVar47;
                      *(ushort *)*palVar15 = uVar24;
                      *(ushort *)((long)*palVar15 + 2) = uVar33;
                      *(ushort *)((long)*palVar15 + 4) = uVar35;
                      *(ushort *)((long)*palVar15 + 6) = uVar37;
                      *(ushort *)(*palVar15 + 1) = uVar39;
                      *(ushort *)((long)*palVar15 + 10) = uVar41;
                      *(ushort *)((long)*palVar15 + 0xc) = uVar43;
                      *(ushort *)((long)*palVar15 + 0xe) = uVar45;
                      vH_00[0] = uVar18 & 0xffffffff;
                      vH_00[1] = uVar23;
                      arr_store_si128(((result->field_4).rowcols)->score_row,vH_00,iVar20,s2Len,
                                      (int32_t)in_R9,in_stack_fffffffffffffec8,bias);
                      auVar6._2_2_ = uVar33;
                      auVar6._0_2_ = uVar24;
                      auVar6._4_2_ = uVar35;
                      auVar6._6_2_ = uVar37;
                      auVar6._8_2_ = uVar39;
                      auVar6._10_2_ = uVar41;
                      auVar6._12_2_ = uVar43;
                      auVar6._14_2_ = uVar45;
                      local_108._0_2_ =
                           ((short)local_108._0_2_ < (short)uVar24) * uVar24 |
                           (ushort)((short)local_108._0_2_ >= (short)uVar24) * local_108._0_2_;
                      local_108._2_2_ =
                           ((short)local_108._2_2_ < (short)uVar33) * uVar33 |
                           (ushort)((short)local_108._2_2_ >= (short)uVar33) * local_108._2_2_;
                      local_108._4_2_ =
                           ((short)local_108._4_2_ < (short)uVar35) * uVar35 |
                           (ushort)((short)local_108._4_2_ >= (short)uVar35) * local_108._4_2_;
                      local_108._6_2_ =
                           ((short)local_108._6_2_ < (short)uVar37) * uVar37 |
                           (ushort)((short)local_108._6_2_ >= (short)uVar37) * local_108._6_2_;
                      local_108._8_2_ =
                           ((short)local_108._8_2_ < (short)uVar39) * uVar39 |
                           (ushort)((short)local_108._8_2_ >= (short)uVar39) * local_108._8_2_;
                      local_108._10_2_ =
                           ((short)local_108._10_2_ < (short)uVar41) * uVar41 |
                           (ushort)((short)local_108._10_2_ >= (short)uVar41) * local_108._10_2_;
                      local_108._12_2_ =
                           ((short)local_108._12_2_ < (short)uVar43) * uVar43 |
                           (ushort)((short)local_108._12_2_ >= (short)uVar43) * local_108._12_2_;
                      local_108._14_2_ =
                           ((short)local_108._14_2_ < (short)uVar45) * uVar45 |
                           (ushort)((short)local_108._14_2_ >= (short)uVar45) * local_108._14_2_;
                      auVar10._4_4_ = uVar26;
                      auVar10._0_4_ = uVar26;
                      auVar10._8_4_ = uVar26;
                      auVar10._12_4_ = uVar26;
                      auVar29 = psubsw(auVar6,auVar10);
                      auVar8._4_4_ = uVar27;
                      auVar8._0_4_ = uVar27;
                      auVar8._8_4_ = uVar27;
                      auVar8._12_4_ = uVar27;
                      auVar49 = psubsw(auVar49,auVar8);
                      auVar30._0_2_ = -(ushort)(auVar29._0_2_ < auVar49._0_2_);
                      auVar30._2_2_ = -(ushort)(auVar29._2_2_ < auVar49._2_2_);
                      auVar30._4_2_ = -(ushort)(auVar29._4_2_ < auVar49._4_2_);
                      auVar30._6_2_ = -(ushort)(auVar29._6_2_ < auVar49._6_2_);
                      auVar30._8_2_ = -(ushort)(auVar29._8_2_ < auVar49._8_2_);
                      auVar30._10_2_ = -(ushort)(auVar29._10_2_ < auVar49._10_2_);
                      auVar30._12_2_ = -(ushort)(auVar29._12_2_ < auVar49._12_2_);
                      auVar30._14_2_ = -(ushort)(auVar29._14_2_ < auVar49._14_2_);
                      if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar30 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar30 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar30 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar30 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar30 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar30 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar30 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar30 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar30 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar30 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar30._14_2_ >> 7 & 1) == 0) && (auVar30._14_2_ & 0x8000) == 0)
                      goto LAB_005676f2;
                      palVar15 = palVar15 + 1;
                    }
                  }
LAB_005676f2:
                  sVar25 = local_108._0_2_;
                  auVar31._0_2_ = -(ushort)(auVar50._0_2_ < sVar25);
                  sVar34 = local_108._2_2_;
                  auVar31._2_2_ = -(ushort)(auVar50._2_2_ < sVar34);
                  sVar36 = local_108._4_2_;
                  auVar31._4_2_ = -(ushort)(auVar50._4_2_ < sVar36);
                  sVar38 = local_108._6_2_;
                  auVar31._6_2_ = -(ushort)(auVar50._6_2_ < sVar38);
                  sVar40 = local_108._8_2_;
                  auVar31._8_2_ = -(ushort)(auVar50._8_2_ < sVar40);
                  sVar42 = local_108._10_2_;
                  auVar31._10_2_ = -(ushort)(auVar50._10_2_ < sVar42);
                  sVar44 = local_108._12_2_;
                  sVar46 = local_108._14_2_;
                  auVar31._12_2_ = -(ushort)(auVar50._12_2_ < sVar44);
                  auVar31._14_2_ = -(ushort)(auVar50._14_2_ < sVar46);
                  palVar15 = palVar14;
                  if ((((((((((((((((auVar31 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar31 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar31 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar31 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar31 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar31 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar31 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar31 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar31 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar31 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar31 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar31 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar31._14_2_ >> 7 & 1) != 0) || (auVar31._14_2_ & 0x8000) != 0) {
                    uVar24 = (ushort)(sVar40 < sVar25) * sVar25 |
                             (ushort)(sVar40 >= sVar25) * sVar40;
                    uVar33 = (ushort)(sVar42 < sVar34) * sVar34 |
                             (ushort)(sVar42 >= sVar34) * sVar42;
                    uVar35 = (ushort)(sVar44 < sVar36) * sVar36 |
                             (ushort)(sVar44 >= sVar36) * sVar44;
                    uVar37 = (ushort)(sVar46 < sVar38) * sVar38 |
                             (ushort)(sVar46 >= sVar38) * sVar46;
                    sVar40 = (ushort)(0 < sVar40) * sVar40;
                    sVar42 = (ushort)(0 < sVar42) * sVar42;
                    sVar44 = (ushort)(0 < sVar44) * sVar44;
                    sVar46 = (ushort)(0 < sVar46) * sVar46;
                    uVar24 = ((short)uVar35 < (short)uVar24) * uVar24 |
                             ((short)uVar35 >= (short)uVar24) * uVar35;
                    uVar33 = ((short)uVar37 < (short)uVar33) * uVar33 |
                             ((short)uVar37 >= (short)uVar33) * uVar37;
                    uVar35 = (sVar40 < (short)uVar35) * uVar35 |
                             (ushort)(sVar40 >= (short)uVar35) * sVar40;
                    uVar37 = (sVar42 < (short)uVar37) * uVar37 |
                             (ushort)(sVar42 >= (short)uVar37) * sVar42;
                    uVar39 = (ushort)(sVar44 < sVar40) * sVar40 |
                             (ushort)(sVar44 >= sVar40) * sVar44;
                    uVar41 = (ushort)(sVar46 < sVar42) * sVar42 |
                             (ushort)(sVar46 >= sVar42) * sVar46;
                    sVar44 = (ushort)(0 < sVar44) * sVar44;
                    sVar46 = (ushort)(0 < sVar46) * sVar46;
                    uVar24 = ((short)uVar33 < (short)uVar24) * uVar24 |
                             ((short)uVar33 >= (short)uVar24) * uVar33;
                    auVar32._0_4_ =
                         CONCAT22(((short)uVar35 < (short)uVar33) * uVar33 |
                                  ((short)uVar35 >= (short)uVar33) * uVar35,uVar24);
                    auVar32._4_2_ =
                         ((short)uVar37 < (short)uVar35) * uVar35 |
                         ((short)uVar37 >= (short)uVar35) * uVar37;
                    auVar32._6_2_ =
                         ((short)uVar39 < (short)uVar37) * uVar37 |
                         ((short)uVar39 >= (short)uVar37) * uVar39;
                    auVar32._8_2_ =
                         ((short)uVar41 < (short)uVar39) * uVar39 |
                         ((short)uVar41 >= (short)uVar39) * uVar41;
                    auVar32._10_2_ =
                         (sVar44 < (short)uVar41) * uVar41 |
                         (ushort)(sVar44 >= (short)uVar41) * sVar44;
                    auVar32._12_2_ =
                         (ushort)(sVar46 < sVar44) * sVar44 | (ushort)(sVar46 >= sVar44) * sVar46;
                    auVar32._14_2_ = (ushort)(0 < sVar46) * sVar46;
                    local_11c = auVar32._0_4_;
                    if ((short)(0x7ffe - (short)iVar13) < (short)uVar24) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_128 = uVar22;
                      goto LAB_005677ba;
                    }
                    auVar29 = pshuflw(auVar32,auVar32,0);
                    uVar28 = auVar29._0_4_;
                    auVar50._4_4_ = uVar28;
                    auVar50._0_4_ = uVar28;
                    auVar50._8_4_ = uVar28;
                    auVar50._12_4_ = uVar28;
                    local_118 = uVar22 & 0xffffffff;
                  }
                  uVar22 = uVar22 + 1;
                  palVar14 = palVar16;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar17 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_sse2_128_16",pcVar17);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}